

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

bool __thiscall google::sparse_hashtable<$6111fa4$>::maybe_shrink(sparse_hashtable<_6111fa4_> *this)

{
  size_type sVar1;
  sparse_hashtable<_6111fa4_> *psVar2;
  sparse_hashtable<_6111fa4_> *psVar3;
  size_type sVar4;
  ulong uVar5;
  sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  *in_RDI;
  float fVar6;
  sparse_hashtable<_6111fa4_> tmp;
  size_type sz;
  float shrink_factor;
  size_type shrink_threshold;
  size_type num_remain;
  bool retval;
  sparse_hashtable<_6111fa4_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  uint uVar7;
  size_type in_stack_ffffffffffffff48;
  sparse_hashtable<_6111fa4_> *in_stack_ffffffffffffff50;
  MoveDontCopyT in_stack_ffffffffffffff5c;
  sparse_hashtable<_6111fa4_> *in_stack_ffffffffffffff60;
  ulong local_30;
  bool local_9;
  
  local_9 = false;
  sVar1 = sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::num_nonempty((sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                          *)&in_RDI[2].super_Hasher.num_compares_);
  psVar2 = (sparse_hashtable<_6111fa4_> *)(sVar1 - *(long *)&in_RDI[2].super_Hasher);
  psVar3 = (sparse_hashtable<_6111fa4_> *)
           sparsehash_internal::
           sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
           ::shrink_threshold(in_RDI);
  if (((psVar3 != (sparse_hashtable<_6111fa4_> *)0x0) && (psVar2 < psVar3)) &&
     (sVar4 = bucket_count((sparse_hashtable<_6111fa4_> *)0x103cd0a), 0x20 < sVar4)) {
    fVar6 = sparsehash_internal::
            sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
            ::shrink_factor(in_RDI);
    local_30 = bucket_count((sparse_hashtable<_6111fa4_> *)0x103cd31);
    do {
      local_30 = local_30 >> 1;
      uVar7 = in_stack_ffffffffffffff24 & 0xffffff;
      if (0x20 < local_30) {
        in_stack_ffffffffffffff1c = (float)local_30;
        uVar5 = (ulong)(in_stack_ffffffffffffff1c * fVar6);
        uVar7 = CONCAT13(psVar2 < (sparse_hashtable<_6111fa4_> *)
                                  (uVar5 | (long)(in_stack_ffffffffffffff1c * fVar6 - 9.223372e+18)
                                           & (long)uVar5 >> 0x3f),(int3)in_stack_ffffffffffffff24);
        in_stack_ffffffffffffff10 = psVar2;
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff1c;
      }
      in_stack_ffffffffffffff24 = uVar7;
    } while ((char)(uVar7 >> 0x18) != '\0');
    sparse_hashtable(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48);
    swap((sparse_hashtable<_6111fa4_> *)CONCAT44(uVar7,in_stack_ffffffffffffff20),
         (sparse_hashtable<_6111fa4_> *)
         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_9 = true;
    ~sparse_hashtable(in_stack_ffffffffffffff10);
  }
  sparsehash_internal::
  sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  ::set_consider_shrink(in_RDI,false);
  return local_9;
}

Assistant:

bool maybe_shrink() {
    assert(table.num_nonempty() >= num_deleted);
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // is a power of two
    assert(bucket_count() >= HT_MIN_BUCKETS);
    bool retval = false;

    // If you construct a hashtable with < HT_DEFAULT_STARTING_BUCKETS,
    // we'll never shrink until you get relatively big, and we'll never
    // shrink below HT_DEFAULT_STARTING_BUCKETS.  Otherwise, something
    // like "dense_hash_set<int> x; x.insert(4); x.erase(4);" will
    // shrink us down to HT_MIN_BUCKETS buckets, which is too small.
    const size_type num_remain = table.num_nonempty() - num_deleted;
    const size_type shrink_threshold = settings.shrink_threshold();
    if (shrink_threshold > 0 && num_remain < shrink_threshold &&
        bucket_count() > HT_DEFAULT_STARTING_BUCKETS) {
      const float shrink_factor = settings.shrink_factor();
      size_type sz = bucket_count() / 2;  // find how much we should shrink
      while (sz > HT_DEFAULT_STARTING_BUCKETS &&
             num_remain < static_cast<size_type>(sz * shrink_factor)) {
        sz /= 2;  // stay a power of 2
      }
      sparse_hashtable tmp(MoveDontCopy, *this, sz);
      swap(tmp);  // now we are tmp
      retval = true;
    }
    settings.set_consider_shrink(false);  // because we just considered it
    return retval;
  }